

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<int>,_ImPlot::GetterXsYRef<int>,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  GetterXsYs<int> *pGVar6;
  TransformerLogLin *pTVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<int> *pGVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImVec2 IVar12;
  double dVar13;
  double dVar14;
  ImVec2 IVar15;
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  uint uVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  pIVar16 = GImPlot;
  pGVar6 = this->Getter1;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  lVar19 = (long)(((pGVar6->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride;
  iVar4 = *(int *)((long)pGVar6->Ys + lVar19);
  dVar13 = log10((double)*(int *)((long)pGVar6->Xs + lVar19) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar17 = GImPlot;
  pIVar8 = pIVar16->CurrentPlot;
  dVar3 = (pIVar8->XAxis).Range.Min;
  iVar5 = pTVar7->YAxis;
  fVar21 = (float)((((double)(float)(dVar13 / pIVar16->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar5].Min.x);
  fVar23 = (float)(((double)iVar4 - pIVar8->YAxis[iVar5].Range.Min) * pIVar16->My[iVar5] +
                  (double)pIVar16->PixelRange[iVar5].Min.y);
  pGVar9 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar9->Count;
  dVar3 = pGVar9->YRef;
  dVar14 = log10((double)*(int *)((long)pGVar9->Xs +
                                 (long)(((prim + 1 + pGVar9->Offset) % iVar4 + iVar4) % iVar4) *
                                 (long)pGVar9->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar8 = pIVar17->CurrentPlot;
  dVar13 = (pIVar8->XAxis).Range.Min;
  iVar4 = pTVar7->YAxis;
  fVar20 = (float)((((double)(float)(dVar14 / pIVar17->LogDenX) *
                     ((pIVar8->XAxis).Range.Max - dVar13) + dVar13) - dVar13) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar4].Min.x);
  fVar25 = (float)((dVar3 - pIVar8->YAxis[iVar4].Range.Min) * pIVar17->My[iVar4] +
                  (double)pIVar17->PixelRange[iVar4].Min.y);
  fVar22 = (this->P12).x;
  fVar24 = fVar22 - fVar20;
  fVar27 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar28 = fVar27 * fVar23 - fVar21 * fVar1;
  fVar22 = fVar22 * fVar25 - fVar20 * fVar2;
  fVar27 = fVar27 - fVar21;
  fVar26 = fVar27 * (fVar2 - fVar25) - fVar24 * (fVar1 - fVar23);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10->col = this->Col;
  pIVar10[1].pos.x = fVar21;
  pIVar10[1].pos.y = fVar23;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[1].col = this->Col;
  IVar15.y = ((fVar2 - fVar25) * fVar28 - (fVar1 - fVar23) * fVar22) / fVar26;
  IVar15.x = (fVar28 * fVar24 - fVar27 * fVar22) / fVar26;
  pIVar10[2].pos = IVar15;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[2].col = this->Col;
  pIVar10[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[3].col = this->Col;
  IVar12.y = fVar25;
  IVar12.x = fVar20;
  pIVar10[4].pos = IVar12;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar10 = DrawList->_VtxWritePtr;
  pIVar10[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar10 + 5;
  puVar11 = DrawList->_IdxWritePtr;
  *puVar11 = DrawList->_VtxCurrentIdx;
  uVar18 = -(uint)(fVar2 < fVar1 && fVar23 < fVar25 || fVar1 < fVar2 && fVar25 < fVar23) & 1;
  puVar11[1] = DrawList->_VtxCurrentIdx + uVar18 + 1;
  puVar11[2] = DrawList->_VtxCurrentIdx + 3;
  puVar11[3] = DrawList->_VtxCurrentIdx + 1;
  puVar11[4] = (uVar18 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar11[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar11 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar21;
  (this->P11).y = fVar23;
  (this->P12).x = fVar20;
  (this->P12).y = fVar25;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }